

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandDrawNumber::Parse(CommandDrawNumber *this,FScanner *sc,bool fullScreenOffsets)

{
  int *piVar1;
  char cVar2;
  SBarInfo *pSVar3;
  bool bVar4;
  bool bVar5;
  EColorRange EVar6;
  uint uVar7;
  FFont *pFVar8;
  PClassActor *pPVar9;
  ClassReg *pCVar10;
  int *piVar11;
  FBaseCVar *pFVar12;
  undefined7 in_register_00000011;
  char *message;
  FString local_48;
  undefined4 local_3c;
  FString *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000011,fullScreenOffsets);
  FScanner::MustGetToken(sc,0x104);
  this->length = sc->Number;
  FScanner::MustGetToken(sc,0x2c);
  bVar4 = FScanner::CheckToken(sc,0x102);
  if (!bVar4) {
    FScanner::MustGetToken(sc,0x101);
  }
  pFVar8 = V_GetFont(sc->String);
  (this->super_CommandDrawString).font = pFVar8;
  if (pFVar8 == (FFont *)0x0) {
    FScanner::ScriptMessage(sc,"Unknown font \'%s\'.",sc->String);
    (this->super_CommandDrawString).font = SmallFont;
  }
  FScanner::MustGetToken(sc,0x2c);
  EVar6 = SBarInfoCommand::GetTranslation((SBarInfoCommand *)this,sc);
  this->normalTranslation = EVar6;
  FScanner::MustGetToken(sc,0x2c);
  bVar4 = FScanner::CheckToken(sc,0x104);
  if (bVar4) {
    this->value = CONSTANT;
    (this->super_CommandDrawString).valueArgument = sc->Number;
    goto LAB_004b6b64;
  }
  bVar4 = FScanner::CheckToken(sc,0x102);
  if (!bVar4) {
    FScanner::MustGetToken(sc,0x101);
  }
  this->value = INVENTORY;
  if (sc->TokenType == 0x101) {
    bVar4 = FScanner::Compare(sc,"health");
    if (bVar4) {
      this->value = HEALTH;
    }
    else {
      bVar4 = FScanner::Compare(sc,"armor");
      if (bVar4) {
        this->value = ARMOR;
      }
      else {
        bVar4 = FScanner::Compare(sc,"ammo1");
        if (bVar4) {
          this->value = AMMO1;
        }
        else {
          bVar4 = FScanner::Compare(sc,"ammo2");
          if (bVar4) {
            this->value = AMMO2;
          }
          else {
            bVar4 = FScanner::Compare(sc,"ammo1capacity");
            if (bVar4) {
              this->value = AMMO1CAPACITY;
            }
            else {
              bVar4 = FScanner::Compare(sc,"ammo2capacity");
              if (bVar4) {
                this->value = AMMO2CAPACITY;
              }
              else {
                bVar4 = FScanner::Compare(sc,"score");
                if (bVar4) {
                  this->value = SCORE;
                }
                else {
                  bVar4 = FScanner::Compare(sc,"ammo");
                  if (bVar4) {
                    bVar4 = FScanner::CheckToken(sc,0x28);
                    this->value = AMMO;
LAB_004b6a8b:
                    if ((bVar4 == false) || (bVar5 = FScanner::CheckToken(sc,0x102), !bVar5)) {
                      FScanner::MustGetToken(sc,0x101);
                    }
                    pPVar9 = PClass::FindActor(sc->String);
                    this->inventoryItem = pPVar9;
                    if ((pPVar9 == (PClassActor *)0x0) ||
                       (bVar5 = PClass::IsAncestorOf
                                          (AAmmo::RegistrationInfo.MyClass,&pPVar9->super_PClass),
                       !bVar5)) {
                      FScanner::ScriptMessage(sc,"\'%s\' is not a type of ammo.",sc->String);
                      pCVar10 = &AAmmo::RegistrationInfo;
LAB_004b6af2:
                      this->inventoryItem = (PClassActor *)pCVar10->MyClass;
                    }
LAB_004b6afc:
                    if (bVar4 != false) {
                      FScanner::MustGetToken(sc,0x29);
                    }
                  }
                  else {
                    bVar4 = FScanner::Compare(sc,"ammocapacity");
                    if (bVar4) {
                      bVar4 = FScanner::CheckToken(sc,0x28);
                      this->value = AMMOCAPACITY;
                      goto LAB_004b6a8b;
                    }
                    bVar4 = FScanner::Compare(sc,"frags");
                    if (bVar4) {
                      this->value = FRAGS;
                      goto LAB_004b6b64;
                    }
                    bVar4 = FScanner::Compare(sc,"kills");
                    if (bVar4) {
                      this->value = KILLS;
                      goto LAB_004b6b64;
                    }
                    bVar4 = FScanner::Compare(sc,"monsters");
                    if (bVar4) {
                      this->value = MONSTERS;
                      goto LAB_004b6b64;
                    }
                    bVar4 = FScanner::Compare(sc,"items");
                    if (bVar4) {
                      this->value = ITEMS;
                      goto LAB_004b6b64;
                    }
                    bVar4 = FScanner::Compare(sc,"totalitems");
                    if (bVar4) {
                      this->value = TOTALITEMS;
                      goto LAB_004b6b64;
                    }
                    bVar4 = FScanner::Compare(sc,"secrets");
                    if (bVar4) {
                      this->value = SECRETS;
                      goto LAB_004b6b64;
                    }
                    bVar4 = FScanner::Compare(sc,"totalsecrets");
                    if (bVar4) {
                      this->value = TOTALSECRETS;
                      goto LAB_004b6b64;
                    }
                    bVar4 = FScanner::Compare(sc,"armorclass");
                    if (bVar4) {
                      this->value = ARMORCLASS;
                      goto LAB_004b6b64;
                    }
                    bVar4 = FScanner::Compare(sc,"savepercent");
                    if (bVar4) {
                      this->value = SAVEPERCENT;
                      goto LAB_004b6b64;
                    }
                    bVar4 = FScanner::Compare(sc,"airtime");
                    if (bVar4) {
                      this->value = AIRTIME;
                      goto LAB_004b6b64;
                    }
                    bVar4 = FScanner::Compare(sc,"accuracy");
                    if (bVar4) {
                      this->value = ACCURACY;
                      goto LAB_004b6b64;
                    }
                    bVar4 = FScanner::Compare(sc,"stamina");
                    if (bVar4) {
                      this->value = STAMINA;
                      goto LAB_004b6b64;
                    }
                    bVar4 = FScanner::Compare(sc,"keys");
                    if (bVar4) {
                      this->value = KEYS;
                      goto LAB_004b6b64;
                    }
                    bVar4 = FScanner::Compare(sc,"globalvar");
                    if (bVar4) {
                      bVar4 = FScanner::CheckToken(sc,0x28);
                      this->value = GLOBALVAR;
LAB_004b7137:
                      FScanner::MustGetToken(sc,0x104);
                      uVar7 = sc->Number;
                      if (0x3f < uVar7) {
                        FScanner::ScriptError(sc,"Global variable number out of range: %d");
                        uVar7 = sc->Number;
                      }
                      (this->super_CommandDrawString).valueArgument = uVar7;
                      goto LAB_004b6afc;
                    }
                    bVar4 = FScanner::Compare(sc,"globalarray");
                    if (bVar4) {
                      bVar4 = FScanner::CheckToken(sc,0x28);
                      this->value = GLOBALARRAY;
                      goto LAB_004b7137;
                    }
                    bVar4 = FScanner::Compare(sc,"poweruptime");
                    if (bVar4) {
                      bVar4 = FScanner::CheckToken(sc,0x28);
                      this->value = POWERUPTIME;
                      if ((!bVar4) || (bVar5 = FScanner::CheckToken(sc,0x102), !bVar5)) {
                        FScanner::MustGetToken(sc,0x101);
                      }
                      pPVar9 = PClass::FindActor(sc->String);
                      this->inventoryItem = pPVar9;
                      if ((pPVar9 != (PClassActor *)0x0) &&
                         (bVar5 = PClass::IsAncestorOf
                                            (APowerupGiver::RegistrationInfo.MyClass,
                                             &pPVar9->super_PClass), bVar5)) goto LAB_004b6afc;
                      FScanner::ScriptMessage(sc,"\'%s\' is not a type of PowerupGiver.",sc->String)
                      ;
                      pCVar10 = &APowerupGiver::RegistrationInfo;
                      goto LAB_004b6af2;
                    }
                    bVar4 = FScanner::Compare(sc,"intcvar");
                    if (bVar4) {
                      bVar4 = FScanner::CheckToken(sc,0x28);
                      this->value = INTCVAR;
                      if ((!bVar4) || (bVar5 = FScanner::CheckToken(sc,0x102), !bVar5)) {
                        FScanner::MustGetToken(sc,0x101);
                      }
                      FString::operator=(&this->cvarName,sc->String);
                      pFVar12 = FindCVar((this->cvarName).Chars,(FBaseCVar **)0x0);
                      if (pFVar12 == (FBaseCVar *)0x0) {
                        message = "CVar \'%s\' does not exist";
                      }
                      else {
                        uVar7 = (*pFVar12->_vptr_FBaseCVar[2])(pFVar12);
                        if (uVar7 < 2) goto LAB_004b6afc;
                        message = "CVar \'%s\' is not an int or bool";
                      }
                      FScanner::ScriptMessage(sc,message,(this->cvarName).Chars);
                      goto LAB_004b6afc;
                    }
                  }
                  if (this->value == INVENTORY) goto LAB_004b6b15;
                }
              }
            }
          }
        }
      }
    }
  }
  else {
LAB_004b6b15:
    pPVar9 = PClass::FindActor(sc->String);
    this->inventoryItem = pPVar9;
    if ((pPVar9 == (PClassActor *)0x0) ||
       (bVar4 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,&pPVar9->super_PClass),
       !bVar4)) {
      FScanner::ScriptMessage(sc,"\'%s\' is not a type of inventory item.",sc->String);
      this->inventoryItem = (PClassActor *)AInventory::RegistrationInfo.MyClass;
    }
  }
LAB_004b6b64:
  FScanner::MustGetToken(sc,0x2c);
  local_38 = &(this->super_CommandDrawString).str;
  piVar1 = &this->interpolationSpeed;
  while (bVar4 = FScanner::CheckToken(sc,0x101), bVar4) {
    bVar4 = FScanner::Compare(sc,"fillzeros");
    if (bVar4) {
      (this->super_CommandDrawString).field_0x5c = 1;
    }
    else {
      bVar4 = FScanner::Compare(sc,"whennotzero");
      if (bVar4) {
        (this->super_CommandDrawString).field_0x5d = 1;
      }
      else {
        bVar4 = FScanner::Compare(sc,"dontcap");
        if (bVar4) {
          (this->super_CommandDrawString).field_0x5e = 1;
        }
        else {
          bVar4 = FScanner::Compare(sc,"drawshadow");
          if (bVar4) {
            bVar4 = FScanner::CheckToken(sc,0x28);
            if (bVar4) {
              FScanner::MustGetToken(sc,0x104);
              (this->super_CommandDrawString).shadowX = sc->Number;
              FScanner::MustGetToken(sc,0x2c);
              FScanner::MustGetToken(sc,0x104);
              (this->super_CommandDrawString).shadowY = sc->Number;
              FScanner::MustGetToken(sc,0x29);
            }
            (this->super_CommandDrawString).shadow = true;
          }
          else {
            bVar4 = FScanner::Compare(sc,"interpolate");
            if (bVar4) {
              FScanner::MustGetToken(sc,0x28);
              FScanner::MustGetToken(sc,0x104);
              *piVar1 = sc->Number;
            }
            else {
              bVar4 = FScanner::Compare(sc,"alignment");
              if (bVar4) {
                FScanner::MustGetToken(sc,0x28);
                FScanner::MustGetToken(sc,0x101);
                bVar4 = FScanner::Compare(sc,"right");
                if (bVar4) {
                  (this->super_CommandDrawString).alignment = ALIGN_RIGHT;
                }
                else {
                  bVar4 = FScanner::Compare(sc,"left");
                  if (bVar4) {
                    (this->super_CommandDrawString).alignment = ALIGN_LEFT;
                  }
                  else {
                    bVar4 = FScanner::Compare(sc,"center");
                    if (bVar4) {
                      (this->super_CommandDrawString).alignment = ALIGN_CENTER;
                    }
                    else {
                      FScanner::ScriptError(sc,"Unknown alignment \'%s\'.",sc->String);
                    }
                  }
                }
              }
              else {
                bVar4 = FScanner::Compare(sc,"prefix");
                if (!bVar4) {
                  FScanner::ScriptError(sc,"Unknown flag \'%s\'.",sc->String);
                  goto LAB_004b6ca7;
                }
                (this->super_CommandDrawString).field_0x5f = 1;
                FScanner::MustGetToken(sc,0x28);
                CommandDrawString::ParseStringValue(&this->super_CommandDrawString,sc);
                FScanner::MustGetToken(sc,0x2c);
                FScanner::MustGetToken(sc,0x102);
                FString::operator=(&this->prefixPadding,sc->String);
                if ((this->super_CommandDrawString).strValue == CONSTANT) {
                  (this->super_CommandDrawString).field_0x5f = 0;
                  FString::operator+(&local_48,local_38);
                  FString::operator=(&this->prefixPadding,&local_48);
                  FString::~FString(&local_48);
                }
              }
            }
            FScanner::MustGetToken(sc,0x29);
          }
        }
      }
    }
LAB_004b6ca7:
    bVar4 = FScanner::CheckToken(sc,0x7c);
    if (!bVar4) {
      FScanner::MustGetToken(sc,0x2c);
    }
  }
  SBarInfoCommand::GetCoordinates
            ((SBarInfoCommand *)this,sc,local_3c._0_1_,&(this->super_CommandDrawString).startX,
             &(this->super_CommandDrawString).y);
  bVar4 = FScanner::CheckToken(sc,0x2c);
  if (bVar4) {
    bVar4 = FScanner::CheckToken(sc,0x104);
    if (bVar4) {
      (this->super_CommandDrawString).spacing = sc->Number;
      bVar4 = FScanner::CheckToken(sc,0x2c);
      if (!bVar4) goto LAB_004b6ecb;
    }
    EVar6 = SBarInfoCommand::GetTranslation((SBarInfoCommand *)this,sc);
    this->lowTranslation = EVar6;
    FScanner::MustGetToken(sc,0x2c);
    FScanner::MustGetToken(sc,0x104);
    this->lowValue = sc->Number;
    bVar4 = FScanner::CheckToken(sc,0x2c);
    if (bVar4) {
      EVar6 = SBarInfoCommand::GetTranslation((SBarInfoCommand *)this,sc);
      this->highTranslation = EVar6;
      FScanner::MustGetToken(sc,0x2c);
      FScanner::MustGetToken(sc,0x104);
      this->highValue = sc->Number;
    }
  }
LAB_004b6ecb:
  FScanner::MustGetToken(sc,0x3b);
  if (this->value == ARMOR) {
    pSVar3 = (this->super_CommandDrawString).super_SBarInfoCommand.script;
    piVar11 = &pSVar3->armorInterpolationSpeed;
    cVar2 = pSVar3->interpolateArmor;
  }
  else {
    if (this->value != HEALTH) {
      return;
    }
    pSVar3 = (this->super_CommandDrawString).super_SBarInfoCommand.script;
    piVar11 = &pSVar3->interpolationSpeed;
    cVar2 = pSVar3->interpolateHealth;
  }
  if (cVar2 == '\0') {
    piVar11 = piVar1;
  }
  *piVar1 = *piVar11;
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			sc.MustGetToken(TK_IntConst);
			length = sc.Number;
			sc.MustGetToken(',');
			if(!sc.CheckToken(TK_StringConst))
				sc.MustGetToken(TK_Identifier);
			font = V_GetFont(sc.String);
			if(font == NULL)
			{
				sc.ScriptMessage("Unknown font '%s'.", sc.String);
				font = SmallFont;
			}
			sc.MustGetToken(',');
			normalTranslation = GetTranslation(sc);
			sc.MustGetToken(',');
			if(sc.CheckToken(TK_IntConst))
			{
				value = CONSTANT;
				valueArgument = sc.Number;
				sc.MustGetToken(',');
			}
			else
			{
				if(!sc.CheckToken(TK_StringConst))
					sc.MustGetToken(TK_Identifier);
				value = INVENTORY;
				if(sc.TokenType == TK_Identifier)
				{
					if(sc.Compare("health"))
						value = HEALTH;
					else if(sc.Compare("armor"))
						value = ARMOR;
					else if(sc.Compare("ammo1"))
						value = AMMO1;
					else if(sc.Compare("ammo2"))
						value = AMMO2;
					else if(sc.Compare("ammo1capacity"))
						value = AMMO1CAPACITY;
					else if(sc.Compare("ammo2capacity"))
						value = AMMO2CAPACITY;
					else if(sc.Compare("score"))
						value = SCORE;
					else if(sc.Compare("ammo")) //request the next string to be an ammo type
					{
						bool parenthesized = sc.CheckToken('(');

						value = AMMO;
						if(!parenthesized || !sc.CheckToken(TK_StringConst))
							sc.MustGetToken(TK_Identifier);
						inventoryItem = PClass::FindActor(sc.String);
						if(inventoryItem == NULL || !RUNTIME_CLASS(AAmmo)->IsAncestorOf(inventoryItem)) //must be a kind of ammo
						{
							sc.ScriptMessage("'%s' is not a type of ammo.", sc.String);
							inventoryItem = RUNTIME_CLASS(AAmmo);
						}

						if(parenthesized) sc.MustGetToken(')');
					}
					else if(sc.Compare("ammocapacity"))
					{
						bool parenthesized = sc.CheckToken('(');

						value = AMMOCAPACITY;
						if(!parenthesized || !sc.CheckToken(TK_StringConst))
							sc.MustGetToken(TK_Identifier);
						inventoryItem = PClass::FindActor(sc.String);
						if(inventoryItem == NULL || !RUNTIME_CLASS(AAmmo)->IsAncestorOf(inventoryItem)) //must be a kind of ammo
						{
							sc.ScriptMessage("'%s' is not a type of ammo.", sc.String);
							inventoryItem = RUNTIME_CLASS(AAmmo);
						}

						if(parenthesized) sc.MustGetToken(')');
					}
					else if(sc.Compare("frags"))
						value = FRAGS;
					else if(sc.Compare("kills"))
						value = KILLS;
					else if(sc.Compare("monsters"))
						value = MONSTERS;
					else if(sc.Compare("items"))
						value = ITEMS;
					else if(sc.Compare("totalitems"))
						value = TOTALITEMS;
					else if(sc.Compare("secrets"))
						value = SECRETS;
					else if(sc.Compare("totalsecrets"))
						value = TOTALSECRETS;
					else if(sc.Compare("armorclass"))
						value = ARMORCLASS;
					else if(sc.Compare("savepercent"))
						value = SAVEPERCENT;
					else if(sc.Compare("airtime"))
						value = AIRTIME;
					else if(sc.Compare("accuracy"))
						value = ACCURACY;
					else if(sc.Compare("stamina"))
						value = STAMINA;
					else if(sc.Compare("keys"))
						value = KEYS;
					else if(sc.Compare("globalvar"))
					{
						bool parenthesized = sc.CheckToken('(');

						value = GLOBALVAR;
						sc.MustGetToken(TK_IntConst);
						if(sc.Number < 0 || sc.Number >= NUM_GLOBALVARS)
							sc.ScriptError("Global variable number out of range: %d", sc.Number);
						valueArgument = sc.Number;

						if(parenthesized) sc.MustGetToken(')');
					}
					else if(sc.Compare("globalarray")) //acts like variable[playernumber()]
					{
						bool parenthesized = sc.CheckToken('(');

						value = GLOBALARRAY;
						sc.MustGetToken(TK_IntConst);
						if(sc.Number < 0 || sc.Number >= NUM_GLOBALVARS)
							sc.ScriptError("Global variable number out of range: %d", sc.Number);
						valueArgument = sc.Number;

						if(parenthesized) sc.MustGetToken(')');
					}
					else if(sc.Compare("poweruptime"))
					{
						bool parenthesized = sc.CheckToken('(');

						value = POWERUPTIME;
						if(!parenthesized || !sc.CheckToken(TK_StringConst))
							sc.MustGetToken(TK_Identifier);
						inventoryItem = PClass::FindActor(sc.String);
						if(inventoryItem == NULL || !RUNTIME_CLASS(APowerupGiver)->IsAncestorOf(inventoryItem))
						{
							sc.ScriptMessage("'%s' is not a type of PowerupGiver.", sc.String);
							inventoryItem = RUNTIME_CLASS(APowerupGiver);
						}

						if(parenthesized) sc.MustGetToken(')');
					}
					else if (sc.Compare("intcvar"))
					{
						bool parenthesized = sc.CheckToken('(');

						value = INTCVAR;

						if (!parenthesized || !sc.CheckToken(TK_StringConst))
							sc.MustGetToken(TK_Identifier);
						
						cvarName = sc.String;

						// We have a name, but make sure it exists. If not, send notification so modders
						// are aware of the situation.
						FBaseCVar *CVar = FindCVar(cvarName, nullptr);

						if (CVar != nullptr)
						{
							ECVarType cvartype = CVar->GetRealType();

							if (!(cvartype == CVAR_Bool || cvartype == CVAR_Int))
							{
								sc.ScriptMessage("CVar '%s' is not an int or bool", cvarName.GetChars());
							}
						}
						else
						{
							sc.ScriptMessage("CVar '%s' does not exist", cvarName.GetChars());
						}
						
						if (parenthesized) sc.MustGetToken(')');
					}
				}
				if(value == INVENTORY)
				{
					inventoryItem = PClass::FindActor(sc.String);
					if(inventoryItem == NULL || !RUNTIME_CLASS(AInventory)->IsAncestorOf(inventoryItem)) //must be a kind of ammo
					{
						sc.ScriptMessage("'%s' is not a type of inventory item.", sc.String);
						inventoryItem = RUNTIME_CLASS(AInventory);
					}
				}
				sc.MustGetToken(',');
			}
			while(sc.CheckToken(TK_Identifier))
			{
				if(sc.Compare("fillzeros"))
					fillZeros = true;
				else if(sc.Compare("whennotzero"))
					whenNotZero = true;
				else if(sc.Compare("dontcap"))
					dontCap = true;
				else if(sc.Compare("drawshadow"))
				{
					if(sc.CheckToken('('))
					{
						sc.MustGetToken(TK_IntConst);
						shadowX = sc.Number;
						sc.MustGetToken(',');
						sc.MustGetToken(TK_IntConst);
						shadowY = sc.Number;
						sc.MustGetToken(')');
					}
					shadow = true;
				}
				else if(sc.Compare("interpolate"))
				{
					sc.MustGetToken('(');
					sc.MustGetToken(TK_IntConst);
					interpolationSpeed = sc.Number;
					sc.MustGetToken(')');
				}
				else if(sc.Compare("alignment"))
				{
					sc.MustGetToken('(');
					sc.MustGetToken(TK_Identifier);
					if(sc.Compare("right"))
						alignment = ALIGN_RIGHT;
					else if(sc.Compare("left"))
						alignment = ALIGN_LEFT;
					else if(sc.Compare("center"))
						alignment = ALIGN_CENTER;
					else
						sc.ScriptError("Unknown alignment '%s'.", sc.String);
					sc.MustGetToken(')');
				}
				else if(sc.Compare("prefix"))
				{
					usePrefix = true;
					sc.MustGetToken('(');
					ParseStringValue(sc);
					sc.MustGetToken(',');
					sc.MustGetToken(TK_StringConst);
					prefixPadding = sc.String;
					if(strValue == CommandDrawString::CONSTANT)
					{
						usePrefix = false; // Use prefix just determines if we tick the string.
						prefixPadding = str + prefixPadding;
					}
					sc.MustGetToken(')');
				}
				else
					sc.ScriptError("Unknown flag '%s'.", sc.String);
				if(!sc.CheckToken('|'))
					sc.MustGetToken(',');
			}
			GetCoordinates(sc, fullScreenOffsets, startX, y);
			if(sc.CheckToken(','))
			{
				bool needsComma = false;
				if(sc.CheckToken(TK_IntConst)) //font spacing
				{
					spacing = sc.Number;
					needsComma = true;
				}
				if(!needsComma || sc.CheckToken(',')) //2nd coloring for "low-on" value
				{
					lowTranslation = GetTranslation(sc);
					sc.MustGetToken(',');
					sc.MustGetToken(TK_IntConst);
					lowValue = sc.Number;
					if(sc.CheckToken(',')) //3rd coloring for "high-on" value
					{
						highTranslation = GetTranslation(sc);
						sc.MustGetToken(',');
						sc.MustGetToken(TK_IntConst);
						highValue = sc.Number;
					}
				}
			}
			sc.MustGetToken(';');

			if(value == HEALTH)
				interpolationSpeed = script->interpolateHealth ? script->interpolationSpeed : interpolationSpeed;
			else if(value == ARMOR)
				interpolationSpeed = script->interpolateArmor ? script->armorInterpolationSpeed : interpolationSpeed;
		}